

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void dwt(wt_object wt,double *inp)

{
  uint uVar1;
  wave_object pwVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  double *sig;
  double *cA;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  ulong local_50;
  int local_34;
  
  uVar4 = wt->siglength;
  local_50 = (ulong)(int)uVar4;
  uVar1 = wt->J;
  wt->length[(long)(int)uVar1 + 1] = uVar4;
  wt->outlength = 0;
  wt->zpad = 0;
  uVar9 = (ulong)uVar1;
  sig = (double *)malloc(local_50 << 3);
  cA = (double *)malloc(local_50 << 3);
  uVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar4) {
    uVar8 = (ulong)uVar4;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    sig[uVar6] = inp[uVar6];
  }
  iVar5 = wt->wave->lpd_len;
  iVar3 = strcmp(wt->ext,"per");
  if (iVar3 == 0) {
    local_34 = 0;
    uVar6 = local_50;
    for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      dVar10 = ceil((double)(int)uVar6 * 0.5);
      uVar4 = (uint)dVar10;
      uVar6 = (ulong)uVar4;
      wt->length[uVar9] = uVar4;
      local_34 = wt->outlength + uVar4;
      wt->outlength = local_34;
    }
    iVar5 = wt->length[1];
    wt->length[0] = iVar5;
    local_34 = local_34 + iVar5;
    wt->outlength = local_34;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      lVar7 = (long)(int)uVar1 - uVar8;
      uVar4 = *(uint *)((long)wt + lVar7 * 4 + 0x58);
      local_34 = local_34 - uVar4;
      iVar5 = strcmp(wt->cmethod,"fft");
      if (iVar5 == 0) {
LAB_00102f79:
        dwt1(wt,sig,(int)local_50,cA,(double *)(wt[1].method + (long)local_34 * 8 + -0x10));
      }
      else {
        iVar5 = strcmp(wt->cmethod,"FFT");
        if (iVar5 == 0) goto LAB_00102f79;
        pwVar2 = wt->wave;
        dwt_per_stride(sig,(int)local_50,pwVar2->lpd,pwVar2->hpd,pwVar2->lpd_len,cA,uVar4,
                       (double *)(wt[1].method + (long)local_34 * 8 + -0x10),1,1);
      }
      local_50 = (ulong)*(uint *)((long)wt + lVar7 * 4 + 0x58);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      if (uVar8 == uVar1 - 1) {
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          *(double *)(wt[1].method + uVar9 * 8 + -0x10) = cA[uVar9];
        }
      }
      else {
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          sig[uVar9] = cA[uVar9];
        }
      }
    }
  }
  else {
    iVar3 = strcmp(wt->ext,"sym");
    if (iVar3 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    local_34 = 0;
    uVar6 = local_50;
    for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      dVar10 = ceil((double)((int)uVar6 + iVar5 + -2) * 0.5);
      uVar4 = (uint)dVar10;
      uVar6 = (ulong)uVar4;
      wt->length[uVar9] = uVar4;
      local_34 = wt->outlength + uVar4;
      wt->outlength = local_34;
    }
    iVar5 = wt->length[1];
    wt->length[0] = iVar5;
    local_34 = local_34 + iVar5;
    wt->outlength = local_34;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = 0;
    }
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      uVar4 = *(uint *)((long)wt + ((long)(int)uVar1 - uVar8) * 4 + 0x58);
      local_34 = local_34 - uVar4;
      iVar5 = strcmp(wt->cmethod,"fft");
      if (iVar5 == 0) {
LAB_00102de4:
        dwt1(wt,sig,(int)local_50,cA,(double *)(wt[1].method + (long)local_34 * 8 + -0x10));
      }
      else {
        iVar5 = strcmp(wt->cmethod,"FFT");
        if (iVar5 == 0) goto LAB_00102de4;
        pwVar2 = wt->wave;
        dwt_sym_stride(sig,(int)local_50,pwVar2->lpd,pwVar2->hpd,pwVar2->lpd_len,cA,uVar4,
                       (double *)(wt[1].method + (long)local_34 * 8 + -0x10),1,1);
      }
      local_50 = (ulong)*(uint *)((long)wt + ((long)(int)uVar1 - uVar8) * 4 + 0x58);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      if (uVar8 == uVar1 - 1) {
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          *(double *)(wt[1].method + uVar9 * 8 + -0x10) = cA[uVar9];
        }
      }
      else {
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          sig[uVar9] = cA[uVar9];
        }
      }
    }
  }
  free(sig);
  free(cA);
  return;
}

Assistant:

void dwt(wt_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp;
	int len_cA;
	double *orig,*orig2;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
	wt->zpad = 1;
	temp_len++;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	*/

	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;

	if (!strcmp(wt->ext,"per")) {
		i = J;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if ( !strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT") ) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_per(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];
			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT")) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_sym(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];

			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	free(orig);
	free(orig2);
}